

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::multiset<int,_std::less<int>,_std::allocator<int>_>,_void>::
     serialize<binlog::detail::QueueWriter>
               (multiset<int,_std::less<int>,_std::allocator<int>_> *s,QueueWriter *ostream)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_color *p_Var2;
  
  *(int *)ostream->_writePos = (int)(s->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  p_Var2 = (_Rb_tree_color *)(ostream->_writePos + 4);
  ostream->_writePos = (char *)p_Var2;
  for (p_Var1 = (s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(s->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    *p_Var2 = p_Var1[1]._M_color;
    p_Var2 = (_Rb_tree_color *)(ostream->_writePos + 4);
    ostream->_writePos = (char *)p_Var2;
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }